

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O0

void Assimp::FBX::Node::WritePropertyNodeAscii
               (string *name,vector<double,_std::allocator<double>_> *v,StreamWriterLE *s,int indent
               )

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  DeadlyImportError *this;
  int local_174;
  int local_170;
  int i_2;
  int j;
  int local_144;
  ulong uStack_140;
  int len;
  size_t i_1;
  int count;
  int local_110;
  allocator local_109;
  int i;
  undefined1 local_e8 [8];
  string vsize;
  undefined1 local_b8 [8];
  Node node;
  char buffer [32];
  int indent_local;
  StreamWriterLE *s_local;
  vector<double,_std::allocator<double>_> *v_local;
  string *name_local;
  
  Node((Node *)local_b8,name);
  Begin((Node *)local_b8,s,false,indent);
  sVar2 = std::vector<double,_std::allocator<double>_>::size(v);
  to_string<unsigned_long>((string *)local_e8,sVar2);
  StreamWriter<false,_false>::PutChar(s,'*');
  StreamWriter<false,_false>::PutString(s,(string *)local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i," {\n",&local_109);
  StreamWriter<false,_false>::PutString(s,(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  for (local_110 = 0; local_110 < indent + 1; local_110 = local_110 + 1) {
    StreamWriter<false,_false>::PutChar(s,'\t');
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&count,"a: ",(allocator *)((long)&i_1 + 7));
  StreamWriter<false,_false>::PutString(s,(string *)&count);
  std::__cxx11::string::~string((string *)&count);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 7));
  i_1._0_4_ = 0;
  uStack_140 = 0;
  while( true ) {
    uVar1 = uStack_140;
    sVar2 = std::vector<double,_std::allocator<double>_>::size(v);
    if (sVar2 <= uVar1) {
      StreamWriter<false,_false>::PutChar(s,'\n');
      for (local_174 = 0; local_174 < indent; local_174 = local_174 + 1) {
        StreamWriter<false,_false>::PutChar(s,'\t');
      }
      StreamWriter<false,_false>::PutChar(s,'}');
      StreamWriter<false,_false>::PutChar(s,' ');
      End((Node *)local_b8,s,false,indent,false);
      std::__cxx11::string::~string((string *)local_e8);
      ~Node((Node *)local_b8);
      return;
    }
    if (uStack_140 != 0) {
      StreamWriter<false,_false>::PutChar(s,',');
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](v,uStack_140);
    local_144 = snprintf((char *)&node.property_start,0x20,"%f",*pvVar3);
    i_1._0_4_ = local_144 + (int)i_1;
    if (0x800 < (int)i_1) {
      StreamWriter<false,_false>::PutChar(s,'\n');
      i_1._0_4_ = 0;
    }
    if ((local_144 < 0) || (0x1f < local_144)) break;
    for (local_170 = 0; local_170 < local_144; local_170 = local_170 + 1) {
      StreamWriter<false,_false>::PutChar(s,buffer[(long)local_170 + -8]);
    }
    uStack_140 = uStack_140 + 1;
  }
  i_2._2_1_ = 1;
  this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&j,"failed to convert double to string",(allocator *)((long)&i_2 + 3));
  DeadlyImportError::DeadlyImportError(this,(string *)&j);
  i_2._2_1_ = 0;
  __cxa_throw(this,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void FBX::Node::WritePropertyNodeAscii(
    const std::string& name,
    const std::vector<double>& v,
    Assimp::StreamWriterLE& s,
    int indent
){
    char buffer[32];
    FBX::Node node(name);
    node.Begin(s, false, indent);
    std::string vsize = to_string(v.size());
    // *<size> {
    s.PutChar('*'); s.PutString(vsize); s.PutString(" {\n");
    // indent + 1
    for (int i = 0; i < indent + 1; ++i) { s.PutChar('\t'); }
    // a: value,value,value,...
    s.PutString("a: ");
    int count = 0;
    for (size_t i = 0; i < v.size(); ++i) {
        if (i > 0) { s.PutChar(','); }
        int len = ai_snprintf(buffer, sizeof(buffer), "%f", v[i]);
        count += len;
        if (count > 2048) { s.PutChar('\n'); count = 0; }
        if (len < 0 || len > 31) {
            // this should never happen
            throw DeadlyExportError("failed to convert double to string");
        }
        for (int j = 0; j < len; ++j) { s.PutChar(buffer[j]); }
    }
    // }
    s.PutChar('\n');
    for (int i = 0; i < indent; ++i) { s.PutChar('\t'); }
    s.PutChar('}'); s.PutChar(' ');
    node.End(s, false, indent, false);
}